

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriter::AddReloc(BinaryWriter *this,RelocType reloc_type,Index index)

{
  reference pvVar1;
  size_t sVar2;
  Index local_2c;
  unsigned_long uStack_28;
  Index symbol_index;
  size_t offset;
  Index local_18;
  RelocType local_14;
  Index index_local;
  RelocType reloc_type_local;
  BinaryWriter *this_local;
  
  local_18 = index;
  local_14 = reloc_type;
  _index_local = this;
  if ((this->current_reloc_section_ == (RelocSection *)0x0) ||
     (this->current_reloc_section_->section_index != this->section_count_)) {
    offset = (size_t)GetSectionName(this->last_section_type_);
    std::
    vector<wabt::(anonymous_namespace)::RelocSection,std::allocator<wabt::(anonymous_namespace)::RelocSection>>
    ::emplace_back<char_const*,unsigned_int&>
              ((vector<wabt::(anonymous_namespace)::RelocSection,std::allocator<wabt::(anonymous_namespace)::RelocSection>>
                *)&this->reloc_sections_,(char **)&offset,&this->section_count_);
    pvVar1 = std::
             vector<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
             ::back(&this->reloc_sections_);
    this->current_reloc_section_ = pvVar1;
  }
  sVar2 = Stream::offset(this->stream_);
  uStack_28 = sVar2 - this->last_section_payload_offset_;
  local_2c = GetSymbolIndex(this,local_14,local_18);
  if (local_2c != 0xffffffff) {
    std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
    emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&>
              ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)
               &this->current_reloc_section_->relocations,&local_14,&stack0xffffffffffffffd8,
               &local_2c);
  }
  return;
}

Assistant:

void BinaryWriter::AddReloc(RelocType reloc_type, Index index) {
  // Add a new reloc section if needed
  if (!current_reloc_section_ ||
      current_reloc_section_->section_index != section_count_) {
    reloc_sections_.emplace_back(GetSectionName(last_section_type_),
                                 section_count_);
    current_reloc_section_ = &reloc_sections_.back();
  }

  // Add a new relocation to the curent reloc section
  size_t offset = stream_->offset() - last_section_payload_offset_;
  Index symbol_index = GetSymbolIndex(reloc_type, index);
  if (symbol_index == kInvalidIndex) {
    // The file is invalid, for example a reference to function 42 where only 10
    // functions are defined.  The user must have already passed --no-check, so
    // no extra warning here is needed.
    return;
  }
  current_reloc_section_->relocations.emplace_back(reloc_type, offset,
                                                   symbol_index);
}